

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void itranspose(double *A,int M,int N)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  size_t sVar13;
  uint uVar14;
  double *local_48;
  
  uVar14 = M - N;
  if (uVar14 == 0) {
    lVar2 = (long)M;
    uVar5 = 0;
    uVar6 = (ulong)(uint)M;
    if (M < 1) {
      uVar6 = uVar5;
    }
    iVar8 = 1;
    pdVar4 = A;
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      lVar10 = (long)iVar8;
      pdVar12 = (double *)(lVar2 * 8 * lVar10 + (long)pdVar4);
      for (; lVar10 < lVar2; lVar10 = lVar10 + 1) {
        dVar1 = *pdVar12;
        *pdVar12 = A[lVar10];
        A[lVar10] = dVar1;
        pdVar12 = pdVar12 + lVar2;
      }
      iVar8 = iVar8 + 1;
      A = A + lVar2;
      pdVar4 = pdVar4 + 1;
    }
    return;
  }
  if (uVar14 == 0 || M < N) {
    if (N <= M) {
      return;
    }
    uVar14 = N - M;
    lVar2 = (long)M;
    sVar13 = (int)uVar14 * lVar2 * 8;
    local_48 = (double *)malloc(sVar13);
    uVar5 = 0;
    uVar6 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar6 = uVar5;
    }
    uVar3 = 0;
    if (0 < M) {
      uVar3 = (ulong)(uint)M;
    }
    pdVar12 = A + lVar2;
    pdVar4 = local_48;
    for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      pdVar11 = pdVar4;
      for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        *pdVar11 = pdVar12[uVar9];
        pdVar11 = pdVar11 + lVar2;
      }
      pdVar12 = pdVar12 + N;
      pdVar4 = pdVar4 + 1;
    }
    pdVar4 = A + lVar2;
    pdVar12 = A + N;
    for (lVar10 = 1; lVar10 < lVar2; lVar10 = lVar10 + 1) {
      memmove(pdVar4,pdVar12,lVar2 * 8);
      pdVar4 = pdVar4 + lVar2;
      pdVar12 = pdVar12 + N;
    }
    iVar8 = 1;
    pdVar4 = A;
    pdVar12 = A;
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      lVar10 = (long)iVar8;
      pdVar11 = (double *)(lVar2 * 8 * lVar10 + (long)pdVar4);
      for (; lVar10 < lVar2; lVar10 = lVar10 + 1) {
        dVar1 = *pdVar11;
        *pdVar11 = pdVar12[lVar10];
        pdVar12[lVar10] = dVar1;
        pdVar11 = pdVar11 + lVar2;
      }
      iVar8 = iVar8 + 1;
      pdVar12 = pdVar12 + lVar2;
      pdVar4 = pdVar4 + 1;
    }
    memcpy(A + (uint)(M * M),local_48,sVar13);
  }
  else {
    lVar2 = (long)N;
    sVar13 = (int)uVar14 * lVar2 * 8;
    local_48 = (double *)malloc(sVar13);
    memcpy(local_48,A + (uint)(N * N),sVar13);
    uVar5 = 0;
    uVar6 = (ulong)(uint)N;
    if (N < 1) {
      uVar6 = uVar5;
    }
    iVar8 = 1;
    pdVar4 = A;
    pdVar12 = A;
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      lVar10 = (long)iVar8;
      pdVar11 = (double *)(lVar2 * 8 * lVar10 + (long)pdVar4);
      for (; lVar10 < lVar2; lVar10 = lVar10 + 1) {
        dVar1 = *pdVar11;
        *pdVar11 = pdVar12[lVar10];
        pdVar12[lVar10] = dVar1;
        pdVar11 = pdVar11 + lVar2;
      }
      iVar8 = iVar8 + 1;
      pdVar12 = pdVar12 + lVar2;
      pdVar4 = pdVar4 + 1;
    }
    lVar7 = (long)M;
    pdVar4 = A + (lVar2 + -1) * lVar2;
    pdVar12 = A + (lVar2 + -1) * lVar7;
    for (lVar10 = lVar2; 1 < lVar10; lVar10 = lVar10 + -1) {
      memmove(pdVar12,pdVar4,lVar7 * 8);
      pdVar4 = pdVar4 + -lVar2;
      pdVar12 = pdVar12 + -lVar7;
    }
    uVar3 = 0;
    uVar5 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar5 = uVar3;
    }
    pdVar4 = A + lVar2;
    pdVar12 = local_48;
    for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      pdVar11 = pdVar12;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        pdVar4[uVar9] = *pdVar11;
        pdVar11 = pdVar11 + lVar2;
      }
      pdVar4 = pdVar4 + lVar7;
      pdVar12 = pdVar12 + 1;
    }
  }
  free(local_48);
  return;
}

Assistant:

void itranspose(double *A, int M, int N) {
	int i, j, p, iter;
	double *buf;
	double temp;

	if (M == N) {
		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}
	} else if (M > N) {

		p = M - N;
		buf = (double*)malloc(sizeof(double)* p * N);

		memcpy(buf, A + N * N, sizeof(*A)*p*N);

		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}

		for (i = N - 1; i >= 1; --i) {
			memmove(A + i*M, A + i*N, sizeof(*A)*M);
		}


		for (i = 0; i < N; ++i) {
			iter = N + i * M;
			for (j = 0; j < p; ++j) {
				A[iter + j] = buf[j*N + i];
			}
		}

		free(buf);
	}
	else if (M < N) {
		p = N - M;
		buf = (double*)malloc(sizeof(double)* p * M);

		for (i = 0; i < M; ++i) {
			iter = M + i*N;
			for (j = 0; j < p; ++j) {
				buf[j*M + i] = A[iter + j];
			}
		}

		for (i = 1; i < M; ++i) {
			memmove(A + i*M, A + i * N, sizeof(*A)*M);
		}

		for (i = 0; i < M; ++i) {
			for (j = i + 1; j < M; ++j) {
				temp = A[i + j*M];
				A[i + j*M] = A[j + i*M];
				A[j + i*M] = temp;
			}
		}
		memcpy(A + M*M, buf, sizeof(*A)*p*M);
		free(buf);
	}
}